

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsemaphore.cpp
# Opt level: O0

bool futexSemaphoreTryAcquire<QDeadlineTimer>
               (QBasicAtomicInteger<unsigned_long_long> *u,int n,QDeadlineTimer timeout)

{
  QDeadlineTimer timer;
  bool bVar1;
  int iVar2;
  QDebug *this;
  int in_ESI;
  char *in_RDI;
  long in_FS_OFFSET;
  quint32 waiterCount;
  quintptr oneWaiter;
  quintptr newValue;
  quintptr nn;
  bool IsTimed;
  quintptr curValue;
  unsigned_long_long *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  QDeadlineTimer *in_stack_ffffffffffffff50;
  quintptr in_stack_ffffffffffffff60;
  QBasicAtomicInteger<unsigned_long_long> *in_stack_ffffffffffffff68;
  undefined3 in_stack_ffffffffffffff90;
  undefined4 uVar3;
  bool local_59;
  QMessageLogger local_48;
  QMessageLogger local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = CONCAT13(1,in_stack_ffffffffffffff90);
  this = (QDebug *)CONCAT44(in_ESI,in_ESI);
  local_28.context.file =
       (char *)QBasicAtomicInteger<unsigned_long_long>::loadAcquire
                         ((QBasicAtomicInteger<unsigned_long_long> *)0x6c8410);
  do {
    iVar2 = futexAvailCounter((quintptr)local_28.context.file);
    if (iVar2 < in_ESI) {
      bVar1 = QDeadlineTimer::hasExpired(in_stack_ffffffffffffff50);
      if (bVar1) {
        local_59 = false;
      }
      else if (((uint)((ulong)local_28.context.file >> 0x20) & 0x7fffffff) == 0x7fffffff) {
        QMessageLogger::QMessageLogger
                  (&local_48,(char *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
                   in_stack_ffffffffffffff44,(char *)in_stack_ffffffffffffff38);
        QMessageLogger::critical(&local_28);
        QDebug::operator<<((QDebug *)in_stack_ffffffffffffff68,in_RDI);
        QDebug::~QDebug(this);
        local_59 = false;
      }
      else {
        QBasicAtomicInteger<unsigned_long_long>::fetchAndAddRelaxed
                  ((QBasicAtomicInteger<unsigned_long_long> *)
                   CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                   (unsigned_long_long)in_stack_ffffffffffffff38);
        local_28.context.file = local_28.context.file + 0x100000000;
        timer.t1._4_4_ = in_ESI;
        timer.t1._0_4_ = uVar3;
        timer._8_8_ = in_RDI;
        bVar1 = futexSemaphoreTryAcquire_loop<true>
                          (in_stack_ffffffffffffff68,(quintptr)(this + 0x20000000),
                           in_stack_ffffffffffffff60,timer);
        if (bVar1) {
          local_59 = true;
        }
        else {
          QBasicAtomicInteger<unsigned_long_long>::fetchAndSubRelaxed
                    ((QBasicAtomicInteger<unsigned_long_long> *)
                     CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                     (unsigned_long_long)in_stack_ffffffffffffff38);
          local_59 = false;
        }
      }
      goto LAB_006c85db;
    }
    bVar1 = QBasicAtomicInteger<unsigned_long_long>::testAndSetOrdered
                      ((QBasicAtomicInteger<unsigned_long_long> *)in_stack_ffffffffffffff50,
                       CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
                       CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                       in_stack_ffffffffffffff38);
  } while (!bVar1);
  local_59 = true;
LAB_006c85db:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_59;
}

Assistant:

bool
futexSemaphoreTryAcquire(QBasicAtomicInteger<quintptr> &u, int n, T timeout)
{
    constexpr bool IsTimed = std::is_same_v<QDeadlineTimer, T>;
    // Try to acquire without waiting (we still loop because the testAndSet
    // call can fail).
    quintptr nn = unsigned(n);
    if (futexHasWaiterCount)
        nn |= quint64(nn) << 32;    // token count replicated in high word

    quintptr curValue = u.loadAcquire();
    while (futexAvailCounter(curValue) >= n) {
        // try to acquire
        quintptr newValue = curValue - nn;
        if (u.testAndSetOrdered(curValue, newValue, curValue))
            return true;        // succeeded!
    }
    if constexpr (IsTimed) {
        if (timeout.hasExpired())
            return false;
    } else {
        if (timeout == Expired)
            return false;
    }

    // we need to wait
    constexpr quintptr oneWaiter = quintptr(Q_UINT64_C(1) << 32); // zero on 32-bit
    if constexpr (futexHasWaiterCount) {
        // We don't use the fetched value from above so futexWait() fails if
        // it changed after the testAndSetOrdered above.
        quint32 waiterCount = (quint64(curValue) >> 32) & 0x7fffffffU;
        if (waiterCount == 0x7fffffffU) {
            qCritical() << "Waiter count overflow in QSemaphore";
            return false;
        }

        // increase the waiter count
        u.fetchAndAddRelaxed(oneWaiter);
        curValue += oneWaiter;

        // Also adjust nn to subtract oneWaiter when we succeed in acquiring.
        nn += oneWaiter;
    }

    if (futexSemaphoreTryAcquire_loop<IsTimed>(u, curValue, nn, timeout))
        return true;

    Q_ASSERT(IsTimed);

    if (futexHasWaiterCount) {
        // decrement the number of threads waiting
        Q_ASSERT(futexHigh32(&u)->loadRelaxed() & 0x7fffffffU);
        u.fetchAndSubRelaxed(oneWaiter);
    }
    return false;
}